

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O1

void test_2d_static<1ul,1ul,30ul,30ul>(void)

{
  int iVar1;
  int j;
  char *pcVar2;
  bool *pbVar3;
  int j_1;
  long lVar4;
  long lVar5;
  size_t true_idx;
  int dptr [961];
  bool *local_f60;
  bool *local_f58;
  bool *local_f50;
  bool *local_f48;
  bool *local_f40;
  bool local_f38 [3848];
  
  local_f38[0] = true;
  local_f58 = (bool *)CONCAT71(local_f58._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",local_f38,
             (bool *)&local_f58);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f58._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_f38,(int *)&local_f58);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f58 = (bool *)CONCAT44(local_f58._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_f38,(int *)&local_f58);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f58 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_f38,(unsigned_long *)&local_f58);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f58 = (bool *)0x3c1;
  pbVar3 = local_f38;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)pbVar3,(unsigned_long *)&local_f58);
  local_f50 = (bool *)0x0;
  do {
    lVar4 = 0;
    local_f40 = pbVar3;
    do {
      local_f60 = (bool *)((long)local_f50 + lVar4);
      local_f58 = local_f60;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_f60,(unsigned_long *)&local_f58);
      local_f48 = local_f38 + (long)local_f58 * 4;
      local_f60 = pbVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_f60,(int **)&local_f48);
      pbVar3[0] = true;
      pbVar3[1] = false;
      pbVar3[2] = false;
      pbVar3[3] = false;
      local_f60 = (bool *)CONCAT44(local_f60._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(int *)pbVar3,
                 (int *)&local_f60);
      lVar4 = lVar4 + 0x1f;
      pbVar3 = pbVar3 + 0x7c;
    } while (lVar4 != 0x3a2);
    local_f50 = (bool *)((long)local_f50 + 1);
    pbVar3 = local_f40 + 4;
  } while (local_f50 != (bool *)0x1e);
  pbVar3 = local_f38;
  lVar4 = 0;
  do {
    lVar5 = 0;
    local_f50 = pbVar3;
    do {
      local_f60 = (bool *)(lVar5 + lVar4);
      local_f58 = local_f60;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_f60,(unsigned_long *)&local_f58);
      local_f48 = local_f38 + (long)local_f58 * 4;
      local_f60 = pbVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_f60,(int **)&local_f48);
      if (lVar5 == 0x3a2) {
        pbVar3[0] = true;
        pbVar3[1] = false;
        pbVar3[2] = false;
        pbVar3[3] = false;
        local_f60 = (bool *)CONCAT44(local_f60._4_4_,0x11);
        pcVar2 = "17";
        iVar1 = 0x45;
LAB_00103f15:
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])",pcVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,iVar1,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                   (int *)pbVar3,(int *)&local_f60);
      }
      else if (lVar4 == 0x1e) {
        pbVar3[0] = true;
        pbVar3[1] = false;
        pbVar3[2] = false;
        pbVar3[3] = false;
        local_f60 = (bool *)CONCAT44(local_f60._4_4_,0x18);
        pcVar2 = "24";
        iVar1 = 0x4d;
        goto LAB_00103f15;
      }
      pbVar3 = pbVar3 + 0x7c;
      lVar5 = lVar5 + 0x1f;
    } while (lVar5 != 0x3c1);
    lVar4 = lVar4 + 1;
    pbVar3 = local_f50 + 4;
    if (lVar4 == 0x1f) {
      pbVar3 = local_f38;
      lVar4 = 0;
      do {
        lVar5 = 0;
        local_f50 = pbVar3;
        do {
          local_f60 = (bool *)(lVar4 + lVar5);
          local_f58 = local_f60;
          boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                    ("(l.index(i, j))","true_idx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x57,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                     (unsigned_long *)&local_f60,(unsigned_long *)&local_f58);
          local_f48 = local_f38 + (long)local_f58 * 4;
          local_f60 = pbVar3;
          boost::detail::test_eq_impl<int*,int*>
                    ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x59,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                     (int **)&local_f60,(int **)&local_f48);
          if (lVar5 == 0x3a2) {
            local_f60 = (bool *)CONCAT44(local_f60._4_4_,0x11);
            pcVar2 = "17";
            iVar1 = 0x5e;
          }
          else if (lVar4 == 0x1e) {
            local_f60 = (bool *)CONCAT44(local_f60._4_4_,0x18);
            pcVar2 = "24";
            iVar1 = 100;
          }
          else {
            local_f60 = (bool *)CONCAT44(local_f60._4_4_,0x2a);
            pcVar2 = "42";
            iVar1 = 0x6a;
          }
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])",pcVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,iVar1,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                     (int *)pbVar3,(int *)&local_f60);
          pbVar3 = pbVar3 + 0x7c;
          lVar5 = lVar5 + 0x1f;
        } while (lVar5 != 0x3c1);
        lVar4 = lVar4 + 1;
        pbVar3 = local_f50 + 4;
      } while (lVar4 != 0x1f);
      return;
    }
  } while( true );
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}